

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

size_t __thiscall
mocker::ir::Builder::getTypeSize(Builder *this,shared_ptr<mocker::ast::Type> *type)

{
  element_type *peVar1;
  shared_ptr<mocker::ast::BuiltinType> *psStack_40;
  shared_ptr<mocker::ast::BuiltinType> p;
  
  psStack_40 = &p;
  std::dynamic_pointer_cast<mocker::ast::BuiltinType,mocker::ast::Type>
            ((shared_ptr<mocker::ast::Type> *)psStack_40);
  peVar1 = p.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (p.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if ((p.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type ==
        String) {
      psStack_40 = (shared_ptr<mocker::ast::BuiltinType> *)0x10;
    }
    else {
      if ((p.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type
          == Null) {
        __assert_fail("p->type != ast::BuiltinType::Null",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp"
                      ,0x3df,
                      "std::size_t mocker::ir::Builder::getTypeSize(const std::shared_ptr<ast::Type> &) const"
                     );
      }
      psStack_40 = (shared_ptr<mocker::ast::BuiltinType> *)0x8;
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  if (peVar1 == (element_type *)0x0) {
    std::dynamic_pointer_cast<mocker::ast::UserDefinedType,mocker::ast::Type>
              ((shared_ptr<mocker::ast::Type> *)&p);
    peVar1 = p.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (p.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      psStack_40 = (shared_ptr<mocker::ast::BuiltinType> *)
                   BuilderContext::getClassSize
                             (this->ctx,
                              (string *)
                              (*(long *)&(p.
                                          super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->type + 0x18));
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (peVar1 == (element_type *)0x0) {
      std::dynamic_pointer_cast<mocker::ast::ArrayType,mocker::ast::Type>
                ((shared_ptr<mocker::ast::Type> *)&p);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&p.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (p.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp"
                      ,1000,
                      "std::size_t mocker::ir::Builder::getTypeSize(const std::shared_ptr<ast::Type> &) const"
                     );
      }
      psStack_40 = (shared_ptr<mocker::ast::BuiltinType> *)0x10;
    }
  }
  return (size_t)psStack_40;
}

Assistant:

std::size_t Builder::getTypeSize(const std::shared_ptr<ast::Type> &type) const {
  if (auto p = std::dynamic_pointer_cast<ast::BuiltinType>(type)) {
    if (p->type == ast::BuiltinType::String)
      return 16;
    assert(p->type != ast::BuiltinType::Null);
    return 8;
  }
  if (auto p = std::dynamic_pointer_cast<ast::UserDefinedType>(type)) {
    return ctx.getClassSize(p->name->val);
  }
  if (auto p = std::dynamic_pointer_cast<ast::ArrayType>(type)) {
    return 16;
  }
  assert(false);
}